

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFont::RenderChar(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  unsigned_short c)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Glyph *pGVar5;
  undefined6 in_register_0000000a;
  float fVar6;
  float fVar7;
  float fVar8;
  float local_58;
  float fStack_54;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  
  if ((0x20 < (uint)CONCAT62(in_register_0000000a,c)) ||
     ((0x100002600U >> ((ulong)c & 0x3f) & 1) == 0)) {
    pGVar5 = FindGlyph(this,c);
    local_58 = pos.x;
    fStack_54 = pos.y;
    if (pGVar5 != (Glyph *)0x0) {
      fVar8 = (float)(-(uint)(size < 0.0) & 0x3f800000 |
                     ~-(uint)(size < 0.0) & (uint)(size / this->FontSize));
      fVar6 = (this->DisplayOffset).x + (float)(int)local_58;
      fVar7 = (this->DisplayOffset).y + (float)(int)fStack_54;
      uVar1 = pGVar5->X0;
      uVar3 = pGVar5->Y0;
      local_30.x = (float)uVar1 * fVar8 + fVar6;
      local_30.y = (float)uVar3 * fVar8 + fVar7;
      uVar2 = pGVar5->X1;
      uVar4 = pGVar5->Y1;
      local_38.x = (float)uVar2 * fVar8 + fVar6;
      local_38.y = (float)uVar4 * fVar8 + fVar7;
      ImDrawList::PrimReserve(draw_list,6,4);
      local_40.x = pGVar5->U0;
      local_40.y = pGVar5->V0;
      local_48.x = pGVar5->U1;
      local_48.y = pGVar5->V1;
      ImDrawList::PrimRectUV(draw_list,&local_30,&local_38,&local_40,&local_48,col);
    }
  }
  return;
}

Assistant:

void ImFont::RenderChar(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, unsigned short c) const
{
    if (c == ' ' || c == '\t' || c == '\n' || c == '\r') // Match behavior of RenderText(), those 4 codepoints are hard-coded.
        return;
    if (const Glyph* glyph = FindGlyph(c))
    {
        float scale = (size >= 0.0f) ? (size / FontSize) : 1.0f;
        pos.x = (float)(int)pos.x + DisplayOffset.x;
        pos.y = (float)(int)pos.y + DisplayOffset.y;
        ImVec2 pos_tl(pos.x + glyph->X0 * scale, pos.y + glyph->Y0 * scale);
        ImVec2 pos_br(pos.x + glyph->X1 * scale, pos.y + glyph->Y1 * scale);
        draw_list->PrimReserve(6, 4);
        draw_list->PrimRectUV(pos_tl, pos_br, ImVec2(glyph->U0, glyph->V0), ImVec2(glyph->U1, glyph->V1), col);
    }
}